

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

UChar * ufmt_getUChars_63(UFormattable *fmt,int32_t *len,UErrorCode *status)

{
  short sVar1;
  ushort uVar2;
  char16_t *pcVar3;
  UBool UVar4;
  int iVar5;
  char16_t *pcVar6;
  Formattable *obj;
  UnicodeString *this;
  char16_t *pcVar7;
  int32_t iVar8;
  bool bVar9;
  
  if (*(int *)(fmt + 5) != 3) {
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_INVALID_FORMAT_ERROR;
    }
    return (UChar *)0x0;
  }
  this = (UnicodeString *)fmt[1];
  if (this == (UnicodeString *)0x0) {
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    this = (UnicodeString *)(fmt + 6);
  }
  if ((len != (int32_t *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    *len = iVar5;
    pcVar6 = icu_63::UnicodeString::getTerminatedBuffer(this);
    return pcVar6;
  }
  uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar2 & 0x11) == 0) {
    pcVar6 = (this->fUnion).fStackFields.fBuffer;
    if ((short)uVar2 < 0) {
      iVar8 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)(short)uVar2 >> 5;
    }
    bVar9 = (uVar2 & 2) == 0;
    pcVar3 = (this->fUnion).fFields.fArray;
    pcVar7 = pcVar6;
    if (bVar9) {
      pcVar7 = pcVar3;
    }
    iVar5 = 0x1b;
    if (bVar9) {
      iVar5 = (this->fUnion).fFields.fCapacity;
    }
    if (iVar8 < iVar5) {
      if ((uVar2 & 8) != 0) {
        if (pcVar7[iVar8] == L'\0') {
          return pcVar7;
        }
        goto LAB_002f7ac8;
      }
      if (((uVar2 & 4) != 0) && (*(int *)(pcVar3 + -2) != 1)) goto LAB_002f7ac8;
    }
    else {
LAB_002f7ac8:
      if (iVar8 == 0x7fffffff) goto LAB_002f7a64;
      UVar4 = icu_63::UnicodeString::cloneArrayIfNeeded
                        (this,iVar8 + 1,-1,'\x01',(int32_t **)0x0,'\0');
      if (UVar4 == '\0') {
        return (UChar *)0x0;
      }
      pcVar7 = pcVar6;
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar7 = (this->fUnion).fFields.fArray;
      }
    }
    pcVar7[iVar8] = L'\0';
  }
  else {
LAB_002f7a64:
    pcVar7 = (char16_t *)0x0;
  }
  return pcVar7;
}

Assistant:

U_DRAFT const UChar* U_EXPORT2
ufmt_getUChars(UFormattable *fmt, int32_t *len, UErrorCode *status) {
  Formattable *obj = Formattable::fromUFormattable(fmt);

  // avoid bogosity by checking the type first.
  if( obj->getType() != Formattable::kString ) {
    if( U_SUCCESS(*status) ){
      *status = U_INVALID_FORMAT_ERROR;
    }
    return NULL;
  }

  // This should return a valid string
  UnicodeString &str = obj->getString(*status);
  if( U_SUCCESS(*status) && len != NULL ) {
    *len = str.length();
  }
  return str.getTerminatedBuffer();
}